

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleARGBFilterCols64_C(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x32,int dx)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  
  uVar4 = (ulong)x32;
  lVar5 = 0;
  while( true ) {
    lVar3 = (long)uVar4 >> 0x10;
    if (dst_width + -1 <= (int)lVar5) break;
    uVar7 = (uint)(uVar4 >> 9) & 0x7f;
    uVar1 = *(uint *)(src_argb + lVar3 * 4);
    uVar2 = *(uint *)(src_argb + lVar3 * 4 + 4);
    uVar8 = uVar7 ^ 0x7f;
    *(uint *)(dst_argb + lVar5 * 4) =
         (uVar2 & 0xff) * uVar7 + (uVar1 & 0xff) * uVar8 >> 7 |
         ((uVar2 >> 0x18) * uVar7 + (uVar1 >> 0x18) * uVar8 & 0xffffff80) << 0x11 |
         ((uVar2 >> 0x10 & 0xff) * uVar7 + (uVar1 >> 0x10 & 0xff) * uVar8) * 0x200 & 0x1ff0000 |
         ((uVar2 >> 8 & 0xff) * uVar7 + (uVar1 >> 8 & 0xff) * uVar8) * 2 & 0x1ff00;
    lVar6 = uVar4 + (long)dx;
    lVar3 = lVar6 >> 0x10;
    uVar7 = dx + (uint)uVar4 >> 9 & 0x7f;
    uVar1 = *(uint *)(src_argb + lVar3 * 4);
    uVar2 = *(uint *)(src_argb + lVar3 * 4 + 4);
    uVar8 = uVar7 ^ 0x7f;
    *(uint *)(dst_argb + lVar5 * 4 + 4) =
         (uVar2 & 0xff) * uVar7 + (uVar1 & 0xff) * uVar8 >> 7 |
         ((uVar2 >> 0x18) * uVar7 + (uVar1 >> 0x18) * uVar8 & 0xffffff80) << 0x11 |
         ((uVar2 >> 0x10 & 0xff) * uVar7 + (uVar1 >> 0x10 & 0xff) * uVar8) * 0x200 & 0x1ff0000 |
         ((uVar2 >> 8 & 0xff) * uVar7 + (uVar1 >> 8 & 0xff) * uVar8) * 2 & 0x1ff00;
    uVar4 = lVar6 + dx;
    lVar5 = lVar5 + 2;
  }
  if ((dst_width & 1U) != 0) {
    uVar8 = (uint)uVar4 >> 9 & 0x7f;
    uVar1 = *(uint *)(src_argb + lVar3 * 4);
    uVar2 = *(uint *)(src_argb + lVar3 * 4 + 4);
    uVar7 = uVar8 ^ 0x7f;
    *(uint *)(dst_argb + lVar5 * 4) =
         (uVar2 & 0xff) * uVar8 + (uVar1 & 0xff) * uVar7 >> 7 |
         ((uVar2 >> 0x18) * uVar8 + (uVar1 >> 0x18) * uVar7 & 0xffffff80) << 0x11 |
         ((uVar2 >> 0x10 & 0xff) * uVar8 + (uVar1 >> 0x10 & 0xff) * uVar7 & 0xff80) << 9 |
         ((uVar2 >> 8 & 0xff) * uVar8 + (uVar1 >> 8 & 0xff) * uVar7) * 2 & 0x1ff00;
  }
  return;
}

Assistant:

void ScaleARGBFilterCols64_C(uint8_t* dst_argb,
                             const uint8_t* src_argb,
                             int dst_width,
                             int x32,
                             int dx) {
  int64_t x = (int64_t)(x32);
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int64_t xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint32_t a = src[xi];
    uint32_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
    x += dx;
    xi = x >> 16;
    xf = (x >> 9) & 0x7f;
    a = src[xi];
    b = src[xi + 1];
    dst[1] = BLENDER(a, b, xf);
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    int64_t xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint32_t a = src[xi];
    uint32_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
  }
}